

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O3

SeatPromptResult *
console_confirm_ssh_host_key
          (SeatPromptResult *__return_storage_ptr__,Seat *seat,char *host,wchar_t port,char *keytype
          ,char *keystr,SeatDialogText *text,HelpCtx helpctx,
          _func_void_void_ptr_SeatPromptResult *callback,void *ctx)

{
  char *__s;
  size_t sVar1;
  uint uVar2;
  size_t len;
  void *buf;
  SeatDialogTextItem *pSVar3;
  char *unaff_R14;
  SeatDialogTextItem *pSVar4;
  ptrlen input;
  termios newmode;
  char line [32];
  termios oldmode;
  termios cf;
  stdio_sink errsink [1];
  termios local_138;
  byte local_f8 [40];
  termios local_d0;
  termios local_94;
  stdio_sink local_58;
  
  stdio_sink_init(&local_58,(FILE *)_stderr);
  premsg(&local_94);
  if (0 < (long)text->nitems) {
    pSVar4 = text->items;
    pSVar3 = pSVar4 + text->nitems;
    do {
      switch(pSVar4->type) {
      case SDT_PARA:
        __s = pSVar4->text;
        sVar1 = strlen(__s);
        input.len = sVar1;
        input.ptr = __s;
        wordwrap(local_58.binarysink_,input,0x3c);
        fputc(10,_stderr);
        break;
      case SDT_DISPLAY:
        console_confirm_ssh_host_key_cold_3();
        break;
      case SDT_SCARY_HEADING:
        console_confirm_ssh_host_key_cold_2();
        break;
      case SDT_PROMPT:
        unaff_R14 = pSVar4->text;
        break;
      case SDT_BATCH_ABORT:
        if (console_batch_mode == true) {
          console_confirm_ssh_host_key_cold_1();
          return __return_storage_ptr__;
        }
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 < pSVar3);
  }
  while( true ) {
    fprintf(_stderr,"%s (y/n, Return cancels connection, i for more info) ",unaff_R14);
    fflush(_stderr);
    tcgetattr(0,&local_d0);
    local_138.c_iflag = local_d0.c_iflag;
    local_138.c_oflag = local_d0.c_oflag;
    local_138.c_line = local_d0.c_line;
    local_138.c_cc[0] = local_d0.c_cc[0];
    local_138.c_cc[1] = local_d0.c_cc[1];
    local_138.c_cc[2] = local_d0.c_cc[2];
    local_138.c_cc[3] = local_d0.c_cc[3];
    local_138.c_cc[4] = local_d0.c_cc[4];
    local_138.c_cc[5] = local_d0.c_cc[5];
    local_138.c_cc[6] = local_d0.c_cc[6];
    local_138.c_cc[7] = local_d0.c_cc[7];
    local_138.c_cc[8] = local_d0.c_cc[8];
    local_138.c_cc[9] = local_d0.c_cc[9];
    local_138.c_cc[10] = local_d0.c_cc[10];
    local_138.c_cc[0xb] = local_d0.c_cc[0xb];
    local_138.c_cc[0xc] = local_d0.c_cc[0xc];
    local_138.c_cc[0xd] = local_d0.c_cc[0xd];
    local_138.c_cc[0xe] = local_d0.c_cc[0xe];
    local_138.c_cc[0xf] = local_d0.c_cc[0xf];
    local_138.c_cc[0x10] = local_d0.c_cc[0x10];
    local_138.c_cc[0x11] = local_d0.c_cc[0x11];
    local_138.c_cc[0x12] = local_d0.c_cc[0x12];
    local_138.c_cc[0x13] = local_d0.c_cc[0x13];
    local_138.c_cc[0x14] = local_d0.c_cc[0x14];
    local_138.c_cc[0x15] = local_d0.c_cc[0x15];
    local_138.c_cc[0x16] = local_d0.c_cc[0x16];
    local_138.c_ispeed = local_d0.c_ispeed;
    local_138.c_ospeed = local_d0.c_ospeed;
    local_138._8_8_ = local_d0._8_8_ | 0xb00000000;
    buf = (void *)0x0;
    tcsetattr(0,0,&local_138);
    local_f8[0] = 0;
    block_and_read((wchar_t)local_f8,buf,len);
    tcsetattr(0,0,&local_d0);
    if ((local_f8[0] & 0xdf) != 0x49) break;
    console_confirm_ssh_host_key_cold_4();
  }
  uVar2 = (uint)local_f8[0];
  if ((((local_f8[0] < 0xe) && ((0x2401U >> (uVar2 & 0x1f) & 1) != 0)) || (uVar2 == 0x51)) ||
     (uVar2 == 0x71)) {
    console_confirm_ssh_host_key_cold_5();
  }
  else {
    if ((local_f8[0] & 0xdf) == 0x59) {
      store_host_key(host,port,keytype,keystr);
    }
    if (stderr_is_a_tty == '\x01') {
      tcsetattr(2,1,(termios *)&local_94);
    }
    __return_storage_ptr__->kind = SPRK_OK;
    __return_storage_ptr__->errdata_lit = (char *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult console_confirm_ssh_host_key(
    Seat *seat, const char *host, int port, const char *keytype,
    char *keystr, SeatDialogText *text, HelpCtx helpctx,
    void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    char line[32];
    struct termios cf;
    const char *prompt;

    stdio_sink errsink[1];
    stdio_sink_init(errsink, stderr);

    premsg(&cf);

    for (SeatDialogTextItem *item = text->items,
             *end = item+text->nitems; item < end; item++) {
        switch (item->type) {
          case SDT_PARA:
            wordwrap(BinarySink_UPCAST(errsink),
                     ptrlen_from_asciz(item->text), 60);
            fputc('\n', stderr);
            break;
          case SDT_DISPLAY:
            fprintf(stderr, "  %s\n", item->text);
            break;
          case SDT_SCARY_HEADING:
            /* Can't change font size or weight in this context */
            fprintf(stderr, "%s\n", item->text);
            break;
          case SDT_BATCH_ABORT:
            if (console_batch_mode) {
                fprintf(stderr, "%s\n", item->text);
                fflush(stderr);
                postmsg(&cf);
                return SPR_SW_ABORT("Cannot confirm a host key in batch mode");
            }
            break;
          case SDT_PROMPT:
            prompt = item->text;
            break;
          default:
            break;
        }
    }

    while (true) {
        fprintf(stderr,
                "%s (y/n, Return cancels connection, i for more info) ",
                prompt);
        fflush(stderr);

        struct termios oldmode, newmode;
        tcgetattr(0, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ECHO | ISIG | ICANON;
        tcsetattr(0, TCSANOW, &newmode);
        line[0] = '\0';
        if (block_and_read(0, line, sizeof(line) - 1) <= 0)
            /* handled below */;
        tcsetattr(0, TCSANOW, &oldmode);

        if (line[0] == 'i' || line[0] == 'I') {
            for (SeatDialogTextItem *item = text->items,
                     *end = item+text->nitems; item < end; item++) {
                switch (item->type) {
                  case SDT_MORE_INFO_KEY:
                    fprintf(stderr, "%s", item->text);
                    break;
                  case SDT_MORE_INFO_VALUE_SHORT:
                    fprintf(stderr, ": %s\n", item->text);
                    break;
                  case SDT_MORE_INFO_VALUE_BLOB:
                    fprintf(stderr, ":\n%s\n", item->text);
                    break;
                  default:
                    break;
                }
            }
        } else {
            break;
        }
    }

    /* In case of misplaced reflexes from another program, also recognise 'q'
     * as 'abandon connection rather than trust this key' */
    if (line[0] != '\0' && line[0] != '\r' && line[0] != '\n' &&
        line[0] != 'q' && line[0] != 'Q') {
        if (line[0] == 'y' || line[0] == 'Y')
            store_host_key(host, port, keytype, keystr);
        postmsg(&cf);
        return SPR_OK;
    } else {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_USER_ABORT;
    }
}